

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeRecordUnpack(KeyInfo *pKeyInfo,int nKey,void *pKey,UnpackedRecord *p)

{
  byte bVar1;
  u32 uVar2;
  uint local_58;
  uint local_50;
  u32 local_4c;
  Mem *pMStack_48;
  u32 serial_type;
  Mem *pMem;
  u32 szHdr;
  uint uStack_34;
  u16 u;
  u32 idx;
  int d;
  uchar *aKey;
  UnpackedRecord *p_local;
  void *pKey_local;
  KeyInfo *pKStack_10;
  int nKey_local;
  KeyInfo *pKeyInfo_local;
  
  pMStack_48 = p->aMem;
  p->default_rc = '\0';
  _idx = pKey;
  aKey = (uchar *)p;
  p_local = (UnpackedRecord *)pKey;
  pKey_local._4_4_ = nKey;
  pKStack_10 = pKeyInfo;
  if (*pKey < 0x80) {
    pMem._0_4_ = (uint)*pKey;
    local_50 = 1;
  }
  else {
    bVar1 = sqlite3GetVarint32((uchar *)pKey,(u32 *)&pMem);
    local_50 = (uint)bVar1;
  }
  szHdr = local_50;
  uStack_34 = (uint)pMem;
  pMem._6_2_ = 0;
  do {
    if ((uint)pMem <= szHdr || pKey_local._4_4_ < (int)uStack_34) break;
    if (*(byte *)((long)_idx + (ulong)szHdr) < 0x80) {
      local_4c = (u32)*(byte *)((long)_idx + (ulong)szHdr);
      local_58 = 1;
    }
    else {
      bVar1 = sqlite3GetVarint32((uchar *)((long)_idx + (ulong)szHdr),&local_4c);
      local_58 = (uint)bVar1;
    }
    szHdr = local_58 + szHdr;
    pMStack_48->enc = pKStack_10->enc;
    pMStack_48->db = pKStack_10->db;
    pMStack_48->szMalloc = 0;
    pMStack_48->z = (char *)0x0;
    uVar2 = sqlite3VdbeSerialGet((uchar *)((long)_idx + (long)(int)uStack_34),local_4c,pMStack_48);
    uStack_34 = uVar2 + uStack_34;
    pMStack_48 = pMStack_48 + 1;
    pMem._6_2_ = pMem._6_2_ + 1;
  } while (pMem._6_2_ < *(ushort *)(aKey + 0x10));
  *(ushort *)(aKey + 0x10) = pMem._6_2_;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeRecordUnpack(
  KeyInfo *pKeyInfo,     /* Information about the record format */
  int nKey,              /* Size of the binary record */
  const void *pKey,      /* The binary record */
  UnpackedRecord *p      /* Populate this structure before returning. */
){
  const unsigned char *aKey = (const unsigned char *)pKey;
  int d; 
  u32 idx;                        /* Offset in aKey[] to read from */
  u16 u;                          /* Unsigned loop counter */
  u32 szHdr;
  Mem *pMem = p->aMem;

  p->default_rc = 0;
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );
  idx = getVarint32(aKey, szHdr);
  d = szHdr;
  u = 0;
  while( idx<szHdr && d<=nKey ){
    u32 serial_type;

    idx += getVarint32(&aKey[idx], serial_type);
    pMem->enc = pKeyInfo->enc;
    pMem->db = pKeyInfo->db;
    /* pMem->flags = 0; // sqlite3VdbeSerialGet() will set this for us */
    pMem->szMalloc = 0;
    pMem->z = 0;
    d += sqlite3VdbeSerialGet(&aKey[d], serial_type, pMem);
    pMem++;
    if( (++u)>=p->nField ) break;
  }
  assert( u<=pKeyInfo->nField + 1 );
  p->nField = u;
}